

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O1

int ffgcvn(fitsfile *fptr,int ncols,int *datatype,int *colnum,LONGLONG firstrow,LONGLONG nrows,
          void **nulval,void **array,int *anynul,int *status)

{
  long lVar1;
  fitsfile *fptr_00;
  long *__ptr;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int *anynul_00;
  ulong uVar5;
  long lVar6;
  LONGLONG firstrow_00;
  int iVar7;
  bool bVar8;
  int typecode;
  fitsfile *local_8c8;
  LONGLONG local_8c0;
  long local_8b8;
  long nrowbuf;
  LONGLONG width;
  LONGLONG ntotrows;
  LONGLONG repeat;
  size_t sizes [255];
  
  local_8c0 = firstrow;
  memset(sizes,0,0x7f8);
  sizes[0xe] = 1;
  sizes[0xc] = 1;
  sizes[0xb] = 1;
  sizes[0x15] = 2;
  sizes[0x14] = 2;
  sizes[0x1e] = 4;
  sizes[0x1f] = 4;
  sizes[0x28] = 8;
  sizes[0x29] = 8;
  sizes[0x50] = 8;
  sizes[0x51] = 8;
  sizes[0x2a] = 4;
  sizes[0x52] = 8;
  sizes[0xa3] = 0x10;
  iVar7 = *status;
  if (iVar7 < 1) {
    if (ncols < 1) {
      *status = 0;
      iVar7 = 0;
    }
    else {
      local_8c8 = fptr;
      __ptr = (long *)malloc((ulong)(uint)ncols << 3);
      fptr_00 = local_8c8;
      if (__ptr == (long *)0x0) {
        *status = 0x71;
        iVar7 = 0x71;
      }
      else {
        ffgnrwll(local_8c8,&ntotrows,status);
        ffgrsz(fptr_00,&nrowbuf,status);
        uVar2 = 999;
        if ((ulong)(ncols - 1) < 999) {
          uVar2 = (ulong)(ncols - 1);
        }
        uVar5 = 0;
        do {
          ffgtclll(fptr_00,colnum[uVar5],&typecode,&repeat,&width,status);
          __ptr[uVar5] = repeat;
          iVar7 = datatype[uVar5];
          if ((((long)iVar7 == 1) || (iVar7 == 0x10)) || (sizes[iVar7] == 0)) {
            ffpmsg("Cannot read from TBIT or TSTRING datatypes (ffgcvn)");
            *status = 0x19a;
          }
          if (typecode < 0) {
            ffpmsg("Cannot read from variable-length data (ffgcvn)");
            *status = 0x140;
          }
        } while ((*status == 0) && (bVar8 = uVar2 != uVar5, uVar5 = uVar5 + 1, bVar8));
        iVar7 = *status;
        if (iVar7 == 0) {
          if (ncols == 1) {
            ffgcv(fptr_00,*datatype,*colnum,local_8c0,1,nrows * *__ptr,*nulval,*array,anynul,status)
            ;
            free(__ptr);
            iVar7 = *status;
          }
          else {
            uVar2 = 1;
            if (1 < ncols) {
              uVar2 = (ulong)(uint)ncols;
            }
            local_8b8 = uVar2 << 2;
            lVar6 = 0;
            firstrow_00 = local_8c0;
            do {
              lVar3 = nrows - lVar6;
              if (lVar3 == 0 || nrows < lVar6) break;
              lVar4 = nrowbuf;
              if (lVar3 < nrowbuf) {
                lVar4 = lVar3;
              }
              lVar3 = 0;
              do {
                lVar1 = *(long *)((long)__ptr + lVar3 * 2);
                anynul_00 = (int *)((long)anynul + lVar3);
                if (anynul == (int *)0x0) {
                  anynul_00 = (int *)0x0;
                }
                ffgcv(local_8c8,*(int *)((long)datatype + lVar3),*(int *)((long)colnum + lVar3),
                      firstrow_00,1,lVar1 * lVar4,*(void **)((long)nulval + lVar3 * 2),
                      (void *)(lVar1 * lVar6 * sizes[*(int *)((long)datatype + lVar3)] +
                              *(long *)((long)array + lVar3 * 2)),anynul_00,status);
                if (*status != 0) {
                  sprintf((char *)&repeat,"Failed to read column %d data rows %lld-%lld (ffgcvn)",
                          (ulong)*(uint *)((long)colnum + lVar3),firstrow_00,
                          firstrow_00 + lVar4 + -1);
                  ffpmsg((char *)&repeat);
                  break;
                }
                lVar3 = lVar3 + 4;
              } while (local_8b8 != lVar3);
              if (*status != 0) {
                lVar4 = 0;
              }
              firstrow_00 = firstrow_00 + lVar4;
              lVar6 = lVar6 + lVar4;
            } while (*status == 0);
            free(__ptr);
            iVar7 = *status;
          }
        }
        else {
          free(__ptr);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int ffgcvn( fitsfile *fptr,   /* I - FITS file pointer                       */
	    int ncols,        /* I - number of columns to read               */
            int  *datatype,   /* I - datatypes of the values                 */
            int  *colnum,     /* I - columns numbers to read (1 = 1st col)   */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)     */
            LONGLONG nrows,       /* I - number of rows to read              */
            void **nulval,    /* I - array of pointers to values for undefined pixels */
            void **array,     /* O - array of pointers to values that are returned    */
            int  *anynul,     /* O - anynul[i] set to 1 if any values in column i are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read arrays of values from NCOLS table columns. This is an optimization
  to read all columns in one pass through the table.  The datatypes of the
  input arrays are defined by the 3rd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements for column i will be set equal to *(nulval[i]), unless nulval[i]=0
  in which case no checking for undefined values will be performed.
  anynul[i] is returned with a value of true if any pixels in column i are undefined.
*/
{
    LONGLONG ntotrows, ndone, nread, currow;
    long nrowbuf;
    LONGLONG *repeats = 0;
    size_t sizes[255] = {0};
    int icol;

    sizes[TBYTE] = sizes[TSBYTE] = sizes[TLOGICAL] = sizeof(char);
    sizes[TUSHORT] = sizes[TSHORT] = sizeof(short int);
    sizes[TINT] = sizes[TUINT] = sizeof(int);
    sizes[TLONG] = sizes[TULONG] = sizeof(long int);
    sizes[TLONGLONG] = sizes[TULONGLONG] = sizeof(LONGLONG);
    sizes[TFLOAT] = sizeof(float);
    sizes[TDOUBLE] = sizeof(double);
    sizes[TDBLCOMPLEX] = 2*sizeof(double);

    if (*status > 0)
        return(*status);

    if (ncols <= 0) return (*status=0);

    repeats = malloc(sizeof(LONGLONG)*ncols);
    if (repeats == 0) return (*status=MEMORY_ALLOCATION);

    fits_get_num_rowsll(fptr, &ntotrows, status);
    fits_get_rowsize(fptr, &nrowbuf, status);

    /* Retrieve column repeats */
    for (icol = 0; (icol < ncols) && (icol < 1000); icol++) {
      int typecode;
      LONGLONG repeat, width;
      fits_get_coltypell(fptr, colnum[icol], &typecode, 
			 &repeat, &width, status);
      repeats[icol] = repeat;

      if (datatype[icol] == TBIT || datatype[icol] == TSTRING ||
	  sizes[datatype[icol]] == 0) {
	ffpmsg("Cannot read from TBIT or TSTRING datatypes (ffgcvn)");
	*status = BAD_DATATYPE;
      }
      if (typecode < 0) {
	ffpmsg("Cannot read from variable-length data (ffgcvn)");
	*status = BAD_DIMEN;
      }

      if (*status) break;
    }
    if (*status) {
      free(repeats);
      return *status;
    }

    /* Optimize for 1 column */
    if (ncols == 1) {
      fits_read_col(fptr, datatype[0], colnum[0], firstrow, 1,
		    nrows*repeats[0], nulval[0], 
		    array[0], anynul ? &(anynul[0]) : 0, status);
      free(repeats);
      return *status;
    }

    /* Scan through file, in chunks of nrowbuf */
    currow = firstrow;
    ndone = 0;
    while (ndone < nrows) {
      int icol;
      nread = (nrows-ndone);  /* Number of rows to read (not elements) */
      if (nread > nrowbuf) nread = nrowbuf;

      for (icol=0; icol<ncols; icol++) {
	LONGLONG nelem1 = (nread*repeats[icol]);
	char *array1 = (char *) array[icol] + repeats[icol]*ndone*sizes[datatype[icol]];

	fits_read_col(fptr, datatype[icol], colnum[icol], currow, 1, 
		      nelem1, nulval[icol], array1, 
		      (anynul ? &(anynul[icol]) : 0), status);
	if (*status) {
	  char errmsg[100];
	  sprintf(errmsg, 
		  "Failed to read column %d data rows %lld-%lld (ffgcvn)",
		  colnum[icol], currow, currow+nread-1);
	  ffpmsg(errmsg);
	  break;
	}
      }

      if (*status) break;
      currow += nread;
      ndone += nread;
    }

    free(repeats);
    return *status;
}